

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O2

void __thiscall
CTestGen9Resource_TestCubeTileYResource_Test::TestBody
          (CTestGen9Resource_TestCubeTileYResource_Test *this)

{
  GMM_GFX_SIZE_T GVar1;
  GMM_RESOURCE_FORMAT GVar2;
  uint uVar3;
  uint32_t uVar4;
  GMM_RESOURCE_INFO *pGVar5;
  TEST_BPP TVar6;
  char *pcVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  undefined8 uStack_158;
  GMM_RESCREATE_PARAMS gmmParams;
  GMM_REQ_OFFSET_INFO OffsetInfo;
  uint local_54;
  AssertHelper local_50;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  internal local_40 [8];
  AssertionResult gtest_ar;
  
  gmmParams.pExistingSysMem = 0;
  gmmParams.Flags.Info = (anon_struct_8_44_94931171_for_Info)0x0;
  gmmParams.MaximumRenamingListLength = 0;
  gmmParams.NoGfxMemory = '\0';
  gmmParams._109_3_ = 0;
  gmmParams.pPreallocatedResInfo = (GMM_RESOURCE_INFO *)0x0;
  gmmParams.BaseAlignment = 0;
  gmmParams.OverridePitch = 0;
  gmmParams.RotateInfo = 0;
  gmmParams._84_4_ = 0;
  gmmParams.BaseHeight = 0;
  gmmParams.Depth = 0;
  gmmParams.MaxLod = 0;
  gmmParams.ArraySize = 0;
  gmmParams.CpTag = 0;
  gmmParams._44_4_ = 0;
  gmmParams.field_6.BaseWidth64 = 0;
  gmmParams.Flags.Wa = (anon_struct_4_14_9f1eeba6_for_Wa)0x0;
  gmmParams.MSAA.SamplePattern = GMM_MSAA_DISABLED;
  gmmParams.MSAA.NumSamples = 0;
  gmmParams.Usage = GMM_RESOURCE_USAGE_UNKNOWN;
  uStack_158 = 4;
  gmmParams.ExistingSysMemSize = 0x100000000;
  gmmParams.Flags.Gpu = (anon_struct_8_45_9b07292e_for_Gpu)0x1000000000;
  gmmParams.Type = RESOURCE_INVALID;
  gmmParams.Format = GMM_FORMAT_A4P4_UNORM_PALETTE1;
  OffsetInfo.StdLayout.TileDepthPitch = (GMM_GFX_SIZE_T)this;
  for (TVar6 = TEST_BPP_8; GVar1 = OffsetInfo.StdLayout.TileDepthPitch, TVar6 != TEST_BPP_128;
      TVar6 = TVar6 + TEST_BPP_16) {
    GVar2 = CTestResource::SetResourceFormat
                      ((CTestResource *)OffsetInfo.StdLayout.TileDepthPitch,TVar6);
    uStack_158 = CONCAT44(GVar2,(undefined4)uStack_158);
    gmmParams.CpTag = 1;
    gmmParams._44_4_ = 0;
    gmmParams.field_6.BaseWidth64 = 0x100000001;
    pGVar5 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&uStack_158);
    CTestResource::VerifyResourceHAlign<true>((CTestResource *)GVar1,pGVar5,0x10);
    CTestResource::VerifyResourceVAlign<true>((CTestResource *)GVar1,pGVar5,4);
    CTestResource::VerifyResourcePitch<true>((CTestResource *)GVar1,pGVar5,0x80);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)GVar1,pGVar5,1);
    CTestResource::VerifyResourceSize<true>((CTestResource *)GVar1,pGVar5,0x1000);
    CTestResource::VerifyResourceQPitch<true>((CTestResource *)GVar1,pGVar5,4);
    iVar9 = 0;
    for (uVar3 = 0; uVar3 != 6; uVar3 = uVar3 + 1) {
      OffsetInfo._0_4_ = 0;
      OffsetInfo.ArrayIndex = 0;
      OffsetInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
      OffsetInfo.Plane = GMM_NO_PLANE;
      OffsetInfo.StdLayout.Offset = 0;
      OffsetInfo.StdLayout.TileRowPitch = 0;
      OffsetInfo.Render.XOffset = 0;
      OffsetInfo.Render.YOffset = 0;
      OffsetInfo.Render.ZOffset = 0;
      OffsetInfo.Render._20_4_ = 0;
      OffsetInfo.Lock.Pitch = 0;
      OffsetInfo.Lock.field_2 =
           (anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3)0x0;
      OffsetInfo.Render.field_0.Offset64 = 0;
      OffsetInfo.Frame = GMM_DISPLAY_BASE;
      OffsetInfo._28_4_ = 0;
      OffsetInfo.Lock.field_0.Offset64 = 0;
      gmmParams.MultiTileArch._0_1_ = 1;
      gmmParams.MultiTileArch.GpuVaMappingSet = '\0';
      gmmParams.MultiTileArch.LocalMemEligibilitySet = '\0';
      gmmParams.MultiTileArch.LocalMemPreferredSet = '\0';
      gmmParams.MultiTileArch.Reserved = 0;
      OffsetInfo.Slice = 0;
      OffsetInfo.MipLevel = uVar3;
      (**(code **)(*(long *)pGVar5 + 0x68))(pGVar5,&gmmParams.MultiTileArch);
      local_48.ptr_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,unsigned_long>
                (local_40,"0","OffsetInfo.Render.Offset64",(int *)&local_48,
                 (unsigned_long *)&OffsetInfo.Lock.Pitch);
      if (local_40[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        pcVar7 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xc1b,pcVar7);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_48);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
      local_48.ptr_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_40,"0","OffsetInfo.Render.XOffset",(int *)&local_48,
                 (uint *)&OffsetInfo.Render);
      if (local_40[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        pcVar7 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xc1c,pcVar7);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_48);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
      local_48.ptr_._0_4_ = iVar9;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                (local_40,"CubeFaceIndex * VAlign","OffsetInfo.Render.YOffset",(uint *)&local_48,
                 (uint *)((long)&OffsetInfo.Render.field_0 + 4));
      if (local_40[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        pcVar7 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xc1d,pcVar7);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_48);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
      local_48.ptr_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_40,"0","OffsetInfo.Render.ZOffset",(int *)&local_48,
                 &OffsetInfo.Render.XOffset);
      if (local_40[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        pcVar7 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xc1e,pcVar7);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_48);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
      iVar9 = iVar9 + 4;
    }
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar5);
  }
  for (TVar6 = TEST_BPP_8; GVar1 = OffsetInfo.StdLayout.TileDepthPitch, TVar6 != TEST_BPP_MAX;
      TVar6 = TVar6 + TEST_BPP_16) {
    GVar2 = CTestResource::SetResourceFormat
                      ((CTestResource *)OffsetInfo.StdLayout.TileDepthPitch,TVar6);
    uStack_158 = CONCAT44(GVar2,(undefined4)uStack_158);
    uVar4 = CTestResource::GetBppValue((CTestResource *)GVar1,TVar6);
    local_54 = 0;
    gmmParams.field_6.BaseWidth = (int)(0x80 / (ulong)uVar4) + 1;
    gmmParams._40_8_ = ZEXT48(gmmParams.field_6.BaseWidth);
    gmmParams.field_6.BaseWidth64._4_4_ = 1;
    pGVar5 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&uStack_158,0x80 % (ulong)uVar4);
    CTestResource::VerifyResourceHAlign<true>((CTestResource *)GVar1,pGVar5,0x10);
    CTestResource::VerifyResourceVAlign<true>((CTestResource *)GVar1,pGVar5,4);
    CTestResource::VerifyResourcePitch<true>((CTestResource *)GVar1,pGVar5,0x100);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)GVar1,pGVar5,2);
    uVar8 = gmmParams.field_6.BaseWidth + 3 & 0xfffffffc;
    CTestResource::VerifyResourceQPitch<true>((CTestResource *)GVar1,pGVar5,(ulong)uVar8);
    CTestResource::VerifyResourceSize<true>
              ((CTestResource *)GVar1,pGVar5,(ulong)(uVar8 * 0x600 + 0x1f00 & 0xffffe000));
    uVar10 = 0;
    for (uVar3 = 0; uVar3 != 6; uVar3 = uVar3 + 1) {
      OffsetInfo._0_4_ = 0;
      OffsetInfo.ArrayIndex = 0;
      OffsetInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
      OffsetInfo.Plane = GMM_NO_PLANE;
      OffsetInfo.StdLayout.Offset = 0;
      OffsetInfo.StdLayout.TileRowPitch = 0;
      OffsetInfo.Render.XOffset = 0;
      OffsetInfo.Render.YOffset = 0;
      OffsetInfo.Render.ZOffset = 0;
      OffsetInfo.Render._20_4_ = 0;
      OffsetInfo.Lock.Pitch = 0;
      OffsetInfo.Lock.field_2 =
           (anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3)0x0;
      OffsetInfo.Render.field_0.Offset64 = 0;
      OffsetInfo.Frame = GMM_DISPLAY_BASE;
      OffsetInfo._28_4_ = 0;
      OffsetInfo.Lock.field_0.Offset64 = 0;
      gmmParams.MultiTileArch._0_1_ = 1;
      gmmParams.MultiTileArch.GpuVaMappingSet = '\0';
      gmmParams.MultiTileArch.LocalMemEligibilitySet = '\0';
      gmmParams.MultiTileArch.LocalMemPreferredSet = '\0';
      gmmParams.MultiTileArch.Reserved = 0;
      OffsetInfo.Slice = 0;
      OffsetInfo.MipLevel = uVar3;
      (**(code **)(*(long *)pGVar5 + 0x68))(pGVar5,&gmmParams.MultiTileArch);
      local_48.ptr_._0_4_ = local_54 & 0xffffe000;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                (local_40,
                 "((CubeFaceIndex * ExpectedQPitch) - ((CubeFaceIndex * ExpectedQPitch) & ((TileSize[0][1]) - 1))) * ExpectedPitch"
                 ,"OffsetInfo.Render.Offset64",(uint *)&local_48,
                 (unsigned_long *)&OffsetInfo.Lock.Pitch);
      if (local_40[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        pcVar7 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xc48,pcVar7);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_48);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
      local_48.ptr_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_40,"0","OffsetInfo.Render.XOffset",(int *)&local_48,
                 (uint *)&OffsetInfo.Render);
      if (local_40[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        pcVar7 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xc49,pcVar7);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_48);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
      local_48.ptr_._0_4_ = uVar10 & 0x1c;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                (local_40,"(CubeFaceIndex * ExpectedQPitch) % TileSize[0][1]",
                 "OffsetInfo.Render.YOffset",(uint *)&local_48,
                 (uint *)((long)&OffsetInfo.Render.field_0 + 4));
      if (local_40[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        pcVar7 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xc4b,pcVar7);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_48);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
      local_48.ptr_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_40,"0","OffsetInfo.Render.ZOffset",(int *)&local_48,
                 &OffsetInfo.Render.XOffset);
      if (local_40[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        pcVar7 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xc4c,pcVar7);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_48);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
      uVar10 = uVar10 + uVar8;
      local_54 = local_54 + uVar8 * 0x100;
    }
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar5);
  }
  return;
}

Assistant:

TEST_F(CTestGen9Resource, TestCubeTileYResource)
{
    // Cube is allocated as an array of 6 2D surface representing each cube face below
    //===============================
    // �q� coordinate  |    face    |
    //      0          |    + x     |
    //      1          |    - x     |
    //      2          |    + y     |
    //      3          |    - y     |
    //      4          |    + z     |
    //      5          |    - z     |
    //===============================

    const uint32_t HAlign = 16;
    const uint32_t VAlign = 4;

    const uint32_t TileSize[1][2] = {128, 32};

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_CUBE;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.TiledY    = 1;
    gmmParams.Flags.Gpu.Texture    = 1;

    // Allocate 1x1 surface within a tile.
    for(uint32_t i = 0; i < TEST_BPP_128; i++) //TEST_BPP_128 cannot fit in a tile as HAlign = 16
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x1;
        gmmParams.BaseHeight  = 0x1;
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign);
        VerifyResourcePitch<true>(ResourceInfo, TileSize[0][0]); // As wide as 1 tile
        VerifyResourcePitchInTiles<true>(ResourceInfo, 1);       // 1 tile wide
        VerifyResourceSize<true>(ResourceInfo, GMM_KBYTE(4));    // All 6 faces should be accomated in a tile.
        VerifyResourceQPitch<true>(ResourceInfo, VAlign);        // Each face should be VAlign rows apart within a tile

        for(uint32_t CubeFaceIndex = 0; CubeFaceIndex < __GMM_MAX_CUBE_FACE; CubeFaceIndex++)
        {
            GMM_REQ_OFFSET_INFO OffsetInfo = {};
            OffsetInfo.ReqRender           = 1;
            OffsetInfo.CubeFace            = static_cast<GMM_CUBE_FACE_ENUM>(CubeFaceIndex);
            ResourceInfo->GetOffset(OffsetInfo);
            EXPECT_EQ(0, OffsetInfo.Render.Offset64);                     // Render offset should be 0 as its on single tile.
            EXPECT_EQ(0, OffsetInfo.Render.XOffset);                      // X Offset should be 0
            EXPECT_EQ(CubeFaceIndex * VAlign, OffsetInfo.Render.YOffset); // Y Offset should be VALIGN * CubeFace Index
            EXPECT_EQ(0, OffsetInfo.Render.ZOffset);
        }

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }

    // Allocate 2 tiles in X dimension.
    // Width and Height of Cube must be equal
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = (TileSize[0][0] / GetBppValue(bpp)) + 1; // 1 pixel larger than 1 tile width
        gmmParams.BaseHeight  = gmmParams.BaseWidth64;                   // Heigth must be equal to width.
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign);

        uint32_t ExpectedPitch = TileSize[0][0] * 2; // As wide as 2 tile
        VerifyResourcePitch<true>(ResourceInfo, ExpectedPitch);
        VerifyResourcePitchInTiles<true>(ResourceInfo, 2); // 2 tile wide

        uint32_t ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight, VAlign);
        VerifyResourceQPitch<true>(ResourceInfo, ExpectedQPitch); // Each face should be Valigned-BaseHeight rows apart

        VerifyResourceSize<true>(ResourceInfo, // PitchInBytes * Rows where Rows = __GMM_MAX_CUBE_FACE x QPitch, then aligned to tile boundary
                                 ExpectedPitch *
                                 GMM_ULT_ALIGN(__GMM_MAX_CUBE_FACE * ExpectedQPitch,
                                               TileSize[0][1]));


        for(uint32_t CubeFaceIndex = 0; CubeFaceIndex < __GMM_MAX_CUBE_FACE; CubeFaceIndex++)
        {
            GMM_REQ_OFFSET_INFO OffsetInfo = {};
            OffsetInfo.ReqRender           = 1;
            OffsetInfo.CubeFace            = static_cast<GMM_CUBE_FACE_ENUM>(CubeFaceIndex);
            ResourceInfo->GetOffset(OffsetInfo);
            EXPECT_EQ(GMM_ULT_ALIGN_FLOOR(CubeFaceIndex * ExpectedQPitch, TileSize[0][1]) * ExpectedPitch,
                      OffsetInfo.Render.Offset64);   // Render offset is tile's base address on which cube face begins.
            EXPECT_EQ(0, OffsetInfo.Render.XOffset); // X Offset should be 0
            EXPECT_EQ((CubeFaceIndex * ExpectedQPitch) % TileSize[0][1],
                      OffsetInfo.Render.YOffset);    // Y Offset should be (CubeFaceIndex * QPitch) % TileHeight
            EXPECT_EQ(0, OffsetInfo.Render.ZOffset); // Z offset N/A should be 0
        }

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}